

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::gc_string> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_string,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
          (gc_heap *this,size_t num_bytes,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args)

{
  slot_allocation_header *psVar1;
  char *pcVar2;
  slot *in_RCX;
  undefined8 extraout_RDX;
  allocation_result aVar3;
  gc_heap_ptr<mjs::gc_string> gVar4;
  undefined1 local_38 [8];
  allocation_result a;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args_local;
  size_t num_bytes_local;
  gc_heap *this_local;
  
  a.obj = in_RCX;
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  a._0_8_ = aVar3.obj;
  local_38._0_4_ = aVar3.pos;
  psVar1 = allocation_result::hdr((allocation_result *)local_38);
  if (psVar1->type == 0xffffffff) {
    pcVar2 = (char *)a._0_8_;
    gc_type_info_registration<mjs::gc_string>::
    construct<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
              ((void *)a._0_8_,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&(a.obj)->allocation);
    pcVar2 = gc_type_info_registration<mjs::gc_string>::index(pcVar2,(int)a.obj);
    psVar1 = allocation_result::hdr((allocation_result *)local_38);
    psVar1->type = (uint32_t)pcVar2;
    gc_heap_ptr<mjs::gc_string>::gc_heap_ptr
              ((gc_heap_ptr<mjs::gc_string> *)this,(gc_heap *)num_bytes,local_38._0_4_);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_string>)gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_string, Args = <const std::basic_string_view<wchar_t> &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}